

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O3

base_learner * multilabel_oaa_setup(options_i *options,vw *all)

{
  int iVar1;
  multi_oaa *dat;
  base_learner *l;
  single_learner *base;
  learner<multi_oaa,_example> *plVar2;
  long lVar3;
  undefined **ppuVar4;
  label_parser *plVar5;
  byte bVar6;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  _func_int ***local_170;
  _func_int **local_168;
  _func_int **local_160 [2];
  long local_150;
  option_group_definition local_148;
  long *local_110;
  long local_108;
  long local_100 [2];
  string local_f0;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar6 = 0;
  dat = calloc_or_throw<multi_oaa>(1);
  dat->k = 0;
  local_d0._0_8_ = (_func_int **)0x1a;
  local_170 = local_160;
  local_170 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_170,(ulong)local_d0);
  local_160[0] = (_func_int **)local_d0._0_8_;
  builtin_strncpy((char *)((long)local_170 + 10)," One Aga",8);
  builtin_strncpy((char *)((long)local_170 + 0x12),"inst All",8);
  *(undefined4 *)local_170 = 0x746c754d;
  builtin_strncpy((char *)((long)local_170 + 4),"ilab",4);
  *(undefined4 *)(local_170 + 1) = 0x4f206c65;
  builtin_strncpy((char *)((long)local_170 + 0xc),"ne A",4);
  local_168 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_170 + local_d0._0_8_) = '\0';
  local_148.m_name._M_dataplus._M_p = (pointer)&local_148.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_170,(char *)(local_d0._0_8_ + (long)local_170));
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  local_f0.field_2._M_allocated_capacity._0_6_ = 0x6c69746c756d;
  local_f0.field_2._M_allocated_capacity._6_2_ = 0x6261;
  local_f0.field_2._8_6_ = 0x61616f5f6c65;
  local_f0._M_string_length = 0xe;
  local_f0.field_2._M_local_buf[0xe] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_d0,&local_f0,&dat->k);
  local_60 = true;
  local_150 = 0x2a;
  local_110 = local_100;
  local_110 = (long *)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_150);
  local_100[0] = local_150;
  builtin_strncpy((char *)((long)local_110 + 0x1a)," with <k",8);
  builtin_strncpy((char *)((long)local_110 + 0x22),"> labels",8);
  local_110[2] = 0x62616c69746c756d;
  local_110[3] = 0x2068746977206c65;
  *local_110 = 0x696167612d656e4f;
  local_110[1] = 0x206c6c612d74736e;
  local_108 = local_150;
  *(char *)((long)local_110 + local_150) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_148,(typed_option<unsigned_long> *)local_d0);
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  local_d0._0_8_ = &PTR__typed_option_002d61c8;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_148);
  local_d0._16_6_ = 0x6c69746c756d;
  local_d0._22_2_ = 0x6261;
  local_d0._24_6_ = 0x61616f5f6c65;
  local_d0._8_8_ = (pointer)0xe;
  local_d0[0x1e] = '\0';
  local_d0._0_8_ = local_d0 + 0x10;
  iVar1 = (*options->_vptr_options_i[1])(options,local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<multi_oaa,_example> *)0x0;
  }
  else {
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::learner<multi_oaa,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true>,predict_or_learn<false>,dat->k,multilabels);
    *(undefined8 *)(plVar2 + 0x58) = *(undefined8 *)(plVar2 + 0x18);
    *(code **)(plVar2 + 0x68) = finish_example;
    ppuVar4 = &MULTILABEL::multilabel;
    plVar5 = &all->p->lp;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      plVar5->default_label = (_func_void_void_ptr *)*ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      plVar5 = (label_parser *)((long)plVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    all->label_type = multi;
    all->delete_prediction = (_func_void_void_ptr *)PTR_delete_label_002daaa0;
    dat = (multi_oaa *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_148.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_name._M_dataplus._M_p != &local_148.m_name.field_2) {
    operator_delete(local_148.m_name._M_dataplus._M_p);
  }
  if (dat != (multi_oaa *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* multilabel_oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<multi_oaa>();
  option_group_definition new_options("Multilabel One Against All");
  new_options.add(make_option("multilabel_oaa", data->k).keep().help("One-against-all multilabel with <k> labels"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multilabel_oaa"))
    return nullptr;

  LEARNER::learner<multi_oaa, example>& l = LEARNER::init_learner(data, as_singleline(setup_base(options, all)),
      predict_or_learn<true>, predict_or_learn<false>, data->k, prediction_type::multilabels);
  l.set_finish_example(finish_example);
  all.p->lp = MULTILABEL::multilabel;
  all.label_type = label_type::multi;
  all.delete_prediction = MULTILABEL::multilabel.delete_label;

  return make_base(l);
}